

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

UTimeZoneNameType icu_63::ZNames::getTZNameType(UTimeZoneNameTypeIndex index)

{
  UTimeZoneNameType local_c;
  UTimeZoneNameTypeIndex index_local;
  
  switch(index) {
  case UTZNM_INDEX_EXEMPLAR_LOCATION:
    local_c = UTZNM_EXEMPLAR_LOCATION;
    break;
  case UTZNM_INDEX_LONG_GENERIC:
    local_c = UTZNM_LONG_GENERIC;
    break;
  case UTZNM_INDEX_LONG_STANDARD:
    local_c = UTZNM_LONG_STANDARD;
    break;
  case UTZNM_INDEX_LONG_DAYLIGHT:
    local_c = UTZNM_LONG_DAYLIGHT;
    break;
  case UTZNM_INDEX_SHORT_GENERIC:
    local_c = UTZNM_SHORT_GENERIC;
    break;
  case UTZNM_INDEX_SHORT_STANDARD:
    local_c = UTZNM_SHORT_STANDARD;
    break;
  case UTZNM_INDEX_SHORT_DAYLIGHT:
    local_c = UTZNM_SHORT_DAYLIGHT;
    break;
  default:
    local_c = UTZNM_UNKNOWN;
  }
  return local_c;
}

Assistant:

static UTimeZoneNameType getTZNameType(UTimeZoneNameTypeIndex index) {
        switch(index) {
        case UTZNM_INDEX_EXEMPLAR_LOCATION: return UTZNM_EXEMPLAR_LOCATION;
        case UTZNM_INDEX_LONG_GENERIC: return UTZNM_LONG_GENERIC;
        case UTZNM_INDEX_LONG_STANDARD: return UTZNM_LONG_STANDARD;
        case UTZNM_INDEX_LONG_DAYLIGHT: return UTZNM_LONG_DAYLIGHT;
        case UTZNM_INDEX_SHORT_GENERIC: return UTZNM_SHORT_GENERIC;
        case UTZNM_INDEX_SHORT_STANDARD: return UTZNM_SHORT_STANDARD;
        case UTZNM_INDEX_SHORT_DAYLIGHT: return UTZNM_SHORT_DAYLIGHT;
        default: return UTZNM_UNKNOWN;
        }
    }